

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.h
# Opt level: O3

void __thiscall
TPZBlockDiagonal<std::complex<float>_>::CopyFrom
          (TPZBlockDiagonal<std::complex<float>_> *this,TPZMatrix<std::complex<float>_> *mat)

{
  TPZMatrix<std::complex<float>_> *cp;
  
  if (mat != (TPZMatrix<std::complex<float>_> *)0x0) {
    cp = (TPZMatrix<std::complex<float>_> *)
         __dynamic_cast(mat,&TPZMatrix<std::complex<float>>::typeinfo,
                        &TPZBlockDiagonal<std::complex<float>>::typeinfo,0);
    if (cp != (TPZMatrix<std::complex<float>_> *)0x0) {
      TPZMatrix<std::complex<float>_>::operator=(&this->super_TPZMatrix<std::complex<float>_>,cp);
      TPZVec<std::complex<float>_>::operator=
                (&this->fStorage,(TPZVec<std::complex<float>_> *)(cp + 1));
      TPZVec<long>::operator=(&this->fBlockPos,(TPZVec<long> *)(cp + 2));
      TPZVec<int>::operator=(&this->fBlockSize,(TPZVec<int> *)(cp + 3));
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "virtual void TPZBlockDiagonal<std::complex<float>>::CopyFrom(const TPZMatrix<TVar> *) [TVar = std::complex<float>]"
             ,0x72);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Aborting...\n",0xc);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzblockdiag.h"
             ,0x38);
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override
  {                                                           
    auto *from = dynamic_cast<const TPZBlockDiagonal<TVar> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }